

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::SetHoleState(Clipper *this,TEdge *e,OutRec *outRec)

{
  bool bVar1;
  reference ppOVar2;
  TEdge *local_30;
  TEdge *e2;
  bool isHole;
  OutRec *outRec_local;
  TEdge *e_local;
  Clipper *this_local;
  
  bVar1 = false;
  for (local_30 = e->prevInAEL; local_30 != (TEdge *)0x0; local_30 = local_30->prevInAEL) {
    if ((-1 < local_30->outIdx) && (bVar1 = (bool)(bVar1 ^ 1), outRec->FirstLeft == (OutRec *)0x0))
    {
      ppOVar2 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::operator[]
                          (&this->m_PolyOuts,(long)local_30->outIdx);
      outRec->FirstLeft = *ppOVar2;
    }
  }
  if (bVar1) {
    outRec->isHole = true;
  }
  return;
}

Assistant:

void Clipper::SetHoleState(TEdge *e, OutRec *outRec)
{
  bool isHole = false;
  TEdge *e2 = e->prevInAEL;
  while (e2)
  {
    if (e2->outIdx >= 0)
    {
      isHole = !isHole;
      if (! outRec->FirstLeft)
        outRec->FirstLeft = m_PolyOuts[e2->outIdx];
    }
    e2 = e2->prevInAEL;
  }
  if (isHole) outRec->isHole = true;
}